

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

int lws_mqtt_client_send_subcribe(lws *wsi,lws_mqtt_subscribe_param_t *sub)

{
  undefined1 *puVar1;
  undefined2 uVar2;
  uint uVar3;
  _lws_mqtt_related *p_Var4;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  lws *wsi_00;
  lws_mqtt_subs_t *plVar8;
  size_t sVar9;
  uint8_t *puVar10;
  uint16_t u;
  uint value;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  char *pcVar14;
  long lVar15;
  uchar *puVar16;
  uint8_t exists [8];
  lws_mqtt_str_t mqtt_vh_payload;
  char local_58 [8];
  uchar *local_50;
  uchar *local_48;
  lws_mqtt_str_t local_40;
  
  puVar16 = wsi->context->pt[wsi->tsi].serv_buf;
  wsi_00 = lws_get_network_wsi(wsi);
  if (sub->num_topics == 0) {
    __assert_fail("sub->num_topics",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x6ed,
                  "int lws_mqtt_client_send_subcribe(struct lws *, lws_mqtt_subscribe_param_t *)");
  }
  if (7 < sub->num_topics) {
    __assert_fail("sub->num_topics < sizeof(exists)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x6ee,
                  "int lws_mqtt_client_send_subcribe(struct lws *, lws_mqtt_subscribe_param_t *)");
  }
  if ((short)wsi->wsistate == 0x119) {
    puVar16[0x10] = 0x82;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    if (sub->num_topics != 0) {
      local_50 = puVar16 + 0x10;
      local_48 = puVar16 + 0x11;
      uVar11 = 0;
      bVar13 = 0;
      do {
        pcVar14 = sub->topic[uVar11].name;
        plVar8 = (lws_mqtt_subs_t *)&wsi_00->mqtt->subs_head;
        do {
          plVar8 = plVar8->next;
          if (plVar8 == (lws_mqtt_subs_t *)0x0) goto LAB_00118ee2;
          iVar6 = strcmp(&plVar8->field_0x9,pcVar14);
        } while (iVar6 != 0);
        if (plVar8->ref_count != '\0') {
          plVar8->ref_count = plVar8->ref_count + '\x01';
          local_58[uVar11] = '\x01';
          bVar13 = bVar13 + 1;
          pcVar14 = sub->topic[uVar11].name;
        }
LAB_00118ee2:
        plVar8 = lws_mqtt_create_sub(wsi->mqtt,pcVar14);
        if (plVar8 == (lws_mqtt_subs_t *)0x0) {
          pcVar14 = "%s: create sub fail\n";
          goto LAB_00118f8f;
        }
        uVar11 = uVar11 + 1;
        uVar3 = sub->num_topics;
        uVar12 = (ulong)uVar3;
      } while (uVar11 < uVar12);
      if (uVar3 != bVar13) {
        if (uVar12 == 0) {
          value = 2;
        }
        else {
          value = 2;
          pcVar14 = local_58;
          lVar15 = 0;
          do {
            if (*pcVar14 == '\0') {
              sVar9 = strlen(*(char **)((long)&sub->topic->name + lVar15));
              value = value + (int)sVar9 + 3;
            }
            pcVar14 = pcVar14 + 1;
            lVar15 = lVar15 + 0x10;
          } while (uVar12 << 4 != lVar15);
        }
        wsi->mqtt->sub_size = (uint16_t)value;
        _lws_log(0x10,"%s: Number of topics = %d, Remaining len = %d\n",
                 "lws_mqtt_client_send_subcribe",(ulong)(uVar3 - bVar13),(ulong)value);
        puVar5 = local_48;
        iVar6 = lws_mqtt_vbi_encode(value,local_48);
        puVar16 = local_50;
        if (wsi->context->pt_serv_buf_size <= ((int)(puVar5 + iVar6) - (int)local_50) + value) {
          pcVar14 = "%s: Payload is too big\n";
LAB_00118f8f:
          _lws_log(1,pcVar14,"lws_mqtt_client_send_subcribe");
          return 1;
        }
        lws_mqtt_str_init(&local_40,puVar5 + iVar6,(uint16_t)value,'\0');
        puVar10 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
        p_Var4 = wsi->mqtt;
        uVar2 = p_Var4->pkt_id;
        u = uVar2 + 1;
        p_Var4->pkt_id = u;
        p_Var4->ack_pkt_id = u;
        lws_ser_wu16be(puVar10,u);
        iVar6 = lws_mqtt_str_advance(&local_40,2);
        if (iVar6 == 0) {
          puVar10 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
          if (sub->num_topics != 0) {
            lVar15 = 0;
            uVar11 = 0;
            do {
              _lws_log(8,"%s: topics[%d] = %s\n","lws_mqtt_client_send_subcribe",uVar11 & 0xffffffff
                       ,*(undefined8 *)((long)&sub->topic->name + lVar15));
              if (local_58[uVar11] == '\0') {
                plVar8 = lws_mqtt_create_sub(wsi_00->mqtt,
                                             *(char **)((long)&sub->topic->name + lVar15));
                if (plVar8 == (lws_mqtt_subs_t *)0x0) goto LAB_001190b0;
                sVar9 = strlen(*(char **)((long)&sub->topic->name + lVar15));
                lws_ser_wu16be(puVar10,(uint16_t)sVar9);
                iVar6 = lws_mqtt_str_advance(&local_40,2);
                if (iVar6 != 0) goto LAB_001190b0;
                puVar10 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
                pcVar14 = *(char **)((long)&sub->topic->name + lVar15);
                sVar9 = strlen(pcVar14);
                lws_strncpy((char *)puVar10,pcVar14,sVar9 + 1);
                sVar9 = strlen(*(char **)((long)&sub->topic->name + lVar15));
                iVar6 = lws_mqtt_str_advance(&local_40,(int)sVar9);
                if (iVar6 != 0) goto LAB_001190b0;
                puVar10 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
                *puVar10 = *(uint8_t *)((long)&sub->topic->qos + lVar15);
                iVar6 = lws_mqtt_str_advance(&local_40,1);
                if (iVar6 != 0) {
                  return 1;
                }
                puVar10 = lws_mqtt_str_next(&local_40,(uint16_t *)0x0);
                puVar16 = local_50;
              }
              uVar11 = uVar11 + 1;
              lVar15 = lVar15 + 0x10;
            } while (uVar11 < sub->num_topics);
          }
          iVar7 = (int)puVar10 - (int)puVar16;
          iVar6 = lws_write(wsi_00,puVar16,(long)iVar7,LWS_WRITE_BINARY);
          if (iVar6 != iVar7) {
            return 1;
          }
          puVar1 = &wsi->mqtt->field_0xfe;
          *puVar1 = *puVar1 | 8;
          return 0;
        }
        goto LAB_001190b0;
      }
    }
    iVar6 = 0;
    _lws_log(4,"%s: all topics already subscribed\n","lws_mqtt_client_send_subcribe");
    iVar7 = user_callback_handle_rxflow
                      (wsi->protocol->callback,wsi,LWS_CALLBACK_MQTT_SUBSCRIBED,wsi->user_space,
                       (void *)0x0,0);
    if (iVar7 < 0) {
      _lws_log(1,"%s: MQTT_SUBSCRIBE failed\n","lws_mqtt_client_send_subcribe");
      iVar6 = -1;
    }
  }
  else {
LAB_001190b0:
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int
lws_mqtt_client_send_subcribe(struct lws *wsi, lws_mqtt_subscribe_param_t *sub)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf + LWS_PRE, *start = b, *p = start;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint8_t exists[8], extant;
	lws_mqtt_subs_t *mysub;
	uint32_t rem_len, n;
	uint32_t __attribute__((unused)) tops;

	assert(sub->num_topics);
	assert(sub->num_topics < sizeof(exists));

	switch (lwsi_state(wsi)) {
	case LRS_ESTABLISHED: /* Protocol connection established */
		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_SUBSCRIBE,
					       0, 0, 0)) {
			lwsl_err("%s: Failed to fill fixed header\n", __func__);
			return 1;
		}

		/*
		 * The stream wants to subscribe to one or more topic, but
		 * the shared nwsi may already be subscribed to some or all of
		 * them from interactions with other streams.  For those cases,
		 * we filter them from the list the child wants until we just
		 * have ones that are new to the nwsi.  If nothing left, we just
		 * synthesize the callback to the child as if SUBACK had come
		 * and we're done, otherwise just ask the server for topics that
		 * are new to the wsi.
		 */

		extant = 0;
		memset(&exists, 0, sizeof(exists));
		for (n = 0; n < sub->num_topics; n++) {
			mysub = lws_mqtt_find_sub(nwsi->mqtt, sub->topic[n].name);
			if (mysub && mysub->ref_count) {
				mysub->ref_count++; /* another stream using it */
				exists[n] = 1;
				extant++;
			}

			/*
			 * Attach the topic we're subscribing to, to wsi->mqtt
			 */
			if (!lws_mqtt_create_sub(wsi->mqtt, sub->topic[n].name)) {
				lwsl_err("%s: create sub fail\n", __func__);
				return 1;
			}
		}

		if (extant == sub->num_topics) {
			/*
			 * It turns out there's nothing to do here, the nwsi has
			 * already subscribed to all the topics this stream
			 * wanted.  Just tell it it can have them.
			 */
			lwsl_notice("%s: all topics already subscribed\n", __func__);
			if (user_callback_handle_rxflow(
				    wsi->protocol->callback,
				    wsi, LWS_CALLBACK_MQTT_SUBSCRIBED,
				    wsi->user_space, NULL, 0) < 0) {
				lwsl_err("%s: MQTT_SUBSCRIBE failed\n",
					 __func__);
				return -1;
			}

			return 0;
		}

		/*
		 * zero or more of the topics already existed, but not all,
		 * so we must go to the server with a filtered list of the
		 * new ones only
		 */

		tops = sub->num_topics - extant;

		/*
		 * Pid + (Topic len field + Topic len + Req. QoS) x Num of Topics
		 */
		rem_len = 2;
		for (n = 0; n < sub->num_topics; n++)
			if (!exists[n])
				rem_len += (2 + strlen(sub->topic[n].name) + 1);

		wsi->mqtt->sub_size = rem_len;

		lwsl_debug("%s: Number of topics = %d, Remaining len = %d\n",
			   __func__, (int)tops, (int)rem_len);

		p += lws_mqtt_vbi_encode(rem_len, p);

		if ((rem_len + lws_ptr_diff(p, start)) >=
					       wsi->context->pt_serv_buf_size) {
			lwsl_err("%s: Payload is too big\n", __func__);
			return 1;
		}

		/* Init lws_mqtt_str */
		lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p, rem_len, 0);
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		/* Packet ID */
		wsi->mqtt->ack_pkt_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, wsi->mqtt->ack_pkt_id);

		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
			return 1;

		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		for (n = 0; n < sub->num_topics; n++) {
			lwsl_info("%s: topics[%d] = %s\n", __func__,
				   (int)n, sub->topic[n].name);

			/* if the nwsi already has it, don't ask server for it */
			if (exists[n])
				continue;

			/*
			 * Attach the topic we're subscribing to, to nwsi->mqtt
			 * so we know the nwsi itself has a subscription to it
			 */

			if (!lws_mqtt_create_sub(nwsi->mqtt, sub->topic[n].name))
				return 1;

			/* Topic's Len */
			lws_ser_wu16be(p, strlen(sub->topic[n].name));
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* Topic Name */
			lws_strncpy((char *)p, sub->topic[n].name,
				    strlen(sub->topic[n].name) + 1);
			if (lws_mqtt_str_advance(&mqtt_vh_payload,
						 strlen(sub->topic[n].name)))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* QoS */
			*p = sub->topic[n].qos;
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 1))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		}
		break;

	default:
		return 1;
	}

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
					lws_ptr_diff(p, start))
		return 1;

	wsi->mqtt->inside_subscribe = 1;

	return 0;
}